

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FindDbName(sqlite3 *db,char *zName)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  Db *pDb;
  int i;
  char *in_stack_ffffffffffffffd8;
  int local_14;
  
  local_14 = -1;
  if (in_RSI != 0) {
    local_14 = *(int *)(in_RDI + 0x28);
    do {
      local_14 = local_14 + -1;
      if (local_14 < 0) {
        return local_14;
      }
      iVar1 = sqlite3_stricmp(in_stack_ffffffffffffffd8,(char *)0x13a493);
      if (iVar1 == 0) {
        return local_14;
      }
    } while ((local_14 != 0) ||
            (iVar1 = sqlite3_stricmp(in_stack_ffffffffffffffd8,(char *)0x13a4b5), iVar1 != 0));
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindDbName(sqlite3 *db, const char *zName){
  int i = -1;         /* Database number */
  if( zName ){
    Db *pDb;
    for(i=(db->nDb-1), pDb=&db->aDb[i]; i>=0; i--, pDb--){
      if( 0==sqlite3_stricmp(pDb->zDbSName, zName) ) break;
      /* "main" is always an acceptable alias for the primary database
      ** even if it has been renamed using SQLITE_DBCONFIG_MAINDBNAME. */
      if( i==0 && 0==sqlite3_stricmp("main", zName) ) break;
    }
  }
  return i;
}